

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void __thiscall xe::TcpIpLink::TcpIpLink(TcpIpLink *this)

{
  deBool dVar1;
  deTimer *pdVar2;
  Error *this_00;
  bool bVar3;
  TcpIpLink *this_local;
  
  CommLink::CommLink(&this->super_CommLink);
  (this->super_CommLink)._vptr_CommLink = (_func_int **)&PTR__TcpIpLink_001b2938;
  de::Socket::Socket(&this->m_socket);
  TcpIpLinkState::TcpIpLinkState(&this->m_state,COMMLINKSTATE_ERROR,"Not connected");
  TcpIpSendThread::TcpIpSendThread(&this->m_sendThread,&this->m_socket,&this->m_state);
  TcpIpRecvThread::TcpIpRecvThread(&this->m_recvThread,&this->m_socket,&this->m_state);
  this->m_keepaliveTimer = (deTimer *)0x0;
  pdVar2 = deTimer_create(keepaliveTimerCallback,this);
  this->m_keepaliveTimer = pdVar2;
  while( true ) {
    dVar1 = deGetFalse();
    bVar3 = false;
    if (dVar1 == 0) {
      bVar3 = this->m_keepaliveTimer != (deTimer *)0x0;
    }
    if (!bVar3) break;
    dVar1 = deGetFalse();
    if (dVar1 == 0) {
      return;
    }
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,(char *)0x0,"m_keepaliveTimer",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
               ,0x1a5);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

TcpIpLink::TcpIpLink (void)
	: m_state			(COMMLINKSTATE_ERROR, "Not connected")
	, m_sendThread		(m_socket, m_state)
	, m_recvThread		(m_socket, m_state)
	, m_keepaliveTimer	(DE_NULL)
{
	m_keepaliveTimer = deTimer_create(keepaliveTimerCallback, this);
	XE_CHECK(m_keepaliveTimer);
}